

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O0

string * __thiscall
tinyusdz::PrimMetas::get_kind_abi_cxx11_(string *__return_storage_ptr__,PrimMetas *this)

{
  bool bVar1;
  value_type *pvVar2;
  Kind v;
  allocator local_19;
  PrimMetas *local_18;
  PrimMetas *this_local;
  
  local_18 = this;
  this_local = (PrimMetas *)__return_storage_ptr__;
  bVar1 = nonstd::optional_lite::optional<tinyusdz::Kind>::has_value(&this->kind);
  if (bVar1) {
    pvVar2 = nonstd::optional_lite::optional<tinyusdz::Kind>::value(&this->kind);
    if (*pvVar2 == UserDef) {
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->_kind_str);
    }
    else {
      pvVar2 = nonstd::optional_lite::optional<tinyusdz::Kind>::value(&this->kind);
      tinyusdz::to_string_abi_cxx11_(__return_storage_ptr__,(tinyusdz *)(ulong)*pvVar2,v);
    }
  }
  else {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_19);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::string PrimMeta::get_kind() const {

  if (kind.has_value()) {
    if (kind.value() == Kind::UserDef) {
      return _kind_str;
    } else {
      return to_string(kind.value());
    }
  }

  return "";
}